

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Glucose::OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
          (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this,
          int *idx)

{
  bool bVar1;
  int iVar2;
  vec<unsigned_int> *this_00;
  uint *puVar3;
  char *pcVar4;
  Var *in_RSI;
  vec<Glucose::vec<unsigned_int>_> *in_RDI;
  int j;
  int i;
  vec<unsigned_int> *vec;
  CRef *in_stack_ffffffffffffffb8;
  vec<Glucose::vec<unsigned_int>_> *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_20;
  int local_1c;
  
  iVar2 = toInt(*in_RSI);
  this_00 = vec<Glucose::vec<unsigned_int>_>::operator[](in_RDI,iVar2);
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    iVar2 = vec<unsigned_int>::size(this_00);
    if (iVar2 <= local_1c) break;
    vec<unsigned_int>::operator[](this_00,local_1c);
    bVar1 = SimpSolver::ClauseDeleted::operator()
                      ((ClauseDeleted *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
    if (!bVar1) {
      puVar3 = vec<unsigned_int>::operator[](this_00,local_1c);
      in_stack_ffffffffffffffc4 = *puVar3;
      puVar3 = vec<unsigned_int>::operator[](this_00,local_20);
      *puVar3 = in_stack_ffffffffffffffc4;
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  }
  vec<unsigned_int>::shrink(this_00,local_1c - local_20);
  this_01 = in_RDI + 1;
  iVar2 = toInt(*in_RSI);
  pcVar4 = vec<char>::operator[]((vec<char> *)this_01,iVar2);
  *pcVar4 = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}